

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

void __thiscall QTimer::timerEvent(QTimer *this,QTimerEvent *e)

{
  parameter_type pVar1;
  TimerId TVar2;
  QTimerPrivate *pQVar3;
  QTimerEvent *in_RSI;
  QTimer *in_RDI;
  QTimerPrivate *d;
  QTimer *in_stack_ffffffffffffffe0;
  
  pQVar3 = d_func((QTimer *)0x42b2f0);
  TVar2 = QTimerEvent::id(in_RSI);
  if (TVar2 == pQVar3->id) {
    pVar1 = QObjectBindableProperty::operator_cast_to_bool
                      ((QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>
                        *)0x42b31a);
    if (pVar1) {
      stop(in_stack_ffffffffffffffe0);
    }
    timeout(in_RDI);
  }
  return;
}

Assistant:

void QTimer::timerEvent(QTimerEvent *e)
{
    Q_D(QTimer);
    if (e->id() == d->id) {
        if (d->single)
            stop();
        emit timeout(QPrivateSignal());
    }
}